

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_artist.cpp
# Opt level: O0

void __thiscall polyscope::VectorArtist::createProgram(VectorArtist *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  long *plVar1;
  element_type *peVar2;
  long in_RDI;
  shared_ptr<polyscope::render::ShaderProgram> *in_stack_fffffffffffffe68;
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffe70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe80;
  allocator_type *in_stack_fffffffffffffe98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffea0;
  iterator in_stack_fffffffffffffea8;
  allocator *paVar3;
  size_type in_stack_fffffffffffffeb0;
  string *local_130;
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [38];
  undefined1 local_a2;
  allocator local_a1;
  string *mat;
  ShaderProgram *in_stack_ffffffffffffff68;
  Engine *in_stack_ffffffffffffff70;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 local_68 [47];
  allocator local_39;
  string local_38 [32];
  undefined1 local_18 [24];
  
  plVar1 = render::engine;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"RAYCAST_VECTOR",&local_39);
  local_a2 = 1;
  mat = (string *)&stack0xffffffffffffff68;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff68,"SHADE_BASECOLOR",&local_a1);
  local_a2 = 0;
  local_78 = &stack0xffffffffffffff68;
  local_70 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x3d1f67);
  __l._M_len = in_stack_fffffffffffffeb0;
  __l._M_array = in_stack_fffffffffffffea8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_stack_fffffffffffffea0,__l,in_stack_fffffffffffffe98);
  (**(code **)(*plVar1 + 0x118))(local_18,plVar1,local_38,local_68,0);
  std::shared_ptr<polyscope::render::ShaderProgram>::operator=
            ((shared_ptr<polyscope::render::ShaderProgram> *)in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe68);
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x3d1fe5);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_fffffffffffffe80);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x3d1fff);
  local_130 = (string *)&local_78;
  do {
    local_130 = local_130 + -0x20;
    std::__cxx11::string::~string(local_130);
  } while (local_130 != (string *)&stack0xffffffffffffff68);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3d2077);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"a_vector",&local_c9);
  (*peVar2->_vptr_ShaderProgram[0x10])
            (peVar2,local_c8,*(undefined8 *)(in_RDI + 0x58),0,0,0xffffffff);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  peVar2 = std::
           __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3d210a);
  paVar3 = &local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"a_position",paVar3);
  (*peVar2->_vptr_ShaderProgram[0x10])
            (peVar2,local_f0,*(undefined8 *)(in_RDI + 0x50),0,0,0xffffffff);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  std::
  __shared_ptr_access<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffe70);
  PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get((PersistentValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(in_RDI + 0xe8));
  render::Engine::setMaterial(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,mat);
  return;
}

Assistant:

void VectorArtist::createProgram() {
  program = render::engine->requestShader("RAYCAST_VECTOR", {"SHADE_BASECOLOR"});

  // Fill buffers
  program->setAttribute("a_vector", vectors);
  program->setAttribute("a_position", bases);

  render::engine->setMaterial(*program, material.get());
}